

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.cpp
# Opt level: O0

void Ptex::v2_4::anon_unknown_3::ApplyN<Ptex::v2_4::PtexHalf>
               (PtexSeparableKernel *k,float *result,void *data,int nChan,int nTxChan)

{
  float weight;
  long lVar1;
  float *pfVar2;
  void *dst;
  int iVar3;
  float *pfVar4;
  undefined8 uStack_90;
  float fStack_88;
  int iStack_84;
  undefined8 uStack_80;
  void *local_78;
  VecAccumN<float> local_6b [3];
  PtexHalf *local_68;
  PtexHalf *pRowEnd;
  float *kup;
  PtexHalf *pEnd;
  PtexHalf *p;
  float *kvp;
  int local_38;
  int rowskip;
  int datalen;
  int rowlen;
  float *rowResult;
  int nTxChan_local;
  int nChan_local;
  void *data_local;
  float *result_local;
  PtexSeparableKernel *k_local;
  
  lVar1 = -((long)nChan * 4 + 0xfU & 0xfffffffffffffff0);
  pfVar4 = (float *)((long)&fStack_88 + lVar1);
  _datalen = pfVar4;
  rowResult._0_4_ = nTxChan;
  rowResult._4_4_ = nChan;
  _nTxChan_local = data;
  data_local = result;
  result_local = (float *)k;
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x995584;
  iVar3 = Res::u(&k->res);
  pfVar2 = result_local;
  rowskip = iVar3 * (int)rowResult;
  local_38 = (int)result_local[3] * (int)rowResult;
  kvp._4_4_ = rowskip - local_38;
  p = *(PtexHalf **)(result_local + 8);
  local_78 = _nTxChan_local;
  uStack_80._4_4_ = result_local[2];
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x9955c9;
  iVar3 = Res::u((Res *)pfVar2);
  pEnd = (PtexHalf *)
         ((long)local_78 +
         (long)(((int)uStack_80._4_4_ * iVar3 + (int)result_local[1]) * (int)rowResult) * 2);
  kup = (float *)(pEnd + (int)result_local[4] * rowskip);
  for (; pEnd != (PtexHalf *)kup; pEnd = pEnd + kvp._4_4_) {
    local_68 = pEnd + local_38;
    pRowEnd = (PtexHalf *)(*(long *)(result_local + 6) + 4);
    *(undefined8 *)((long)&uStack_90 + lVar1) = 0x99565c;
    PtexUtils::VecMultN<Ptex::v2_4::PtexHalf>::operator()
              (*(VecMultN<Ptex::v2_4::PtexHalf> **)(&stack0xffffffffffffff90 + lVar1),
               *(float **)((long)&local_78 + lVar1),*(PtexHalf **)((long)&uStack_80 + lVar1),
               *(int *)((long)&iStack_84 + lVar1),*pfVar4);
    for (pEnd = pEnd + (int)rowResult; dst = data_local, iVar3 = rowResult._4_4_, pfVar2 = _datalen,
        pEnd != local_68; pEnd = pEnd + (int)rowResult) {
      pRowEnd = pRowEnd + 2;
      *(undefined8 *)((long)&uStack_90 + lVar1) = 0x9956a1;
      PtexUtils::VecAccumN<Ptex::v2_4::PtexHalf>::operator()
                (*(VecAccumN<Ptex::v2_4::PtexHalf> **)(&stack0xffffffffffffff90 + lVar1),
                 *(float **)((long)&local_78 + lVar1),*(PtexHalf **)((long)&uStack_80 + lVar1),
                 *(int *)((long)&iStack_84 + lVar1),*pfVar4);
    }
    weight = *(float *)p;
    p = p + 2;
    *(undefined8 *)((long)&uStack_90 + lVar1) = 0x9956de;
    PtexUtils::VecAccumN<float>::operator()(local_6b,(float *)dst,pfVar2,iVar3,weight);
  }
  return;
}

Assistant:

void ApplyN(PtexSeparableKernel& k, float* result, void* data, int nChan, int nTxChan)
    {
        float* rowResult = (float*) alloca(nChan*sizeof(float));
        int rowlen = k.res.u() * nTxChan;
        int datalen = k.uw * nTxChan;
        int rowskip = rowlen - datalen;
        float* kvp = k.kv;
        T* p = static_cast<T*>(data) + (k.v * k.res.u() + k.u) * nTxChan;
        T* pEnd = p + k.vw * rowlen;
        while (p != pEnd)
        {
            float* kup = k.ku;
            T* pRowEnd = p + datalen;
            // just mult and copy first element
            PtexUtils::VecMultN<T>()(rowResult, p, nChan, *kup++);
            p += nTxChan;
            // accumulate remaining elements
            while (p != pRowEnd) {
                // rowResult[i] = p[i] * ku[u] for i in {0..n-1}
                PtexUtils::VecAccumN<T>()(rowResult, p, nChan, *kup++);
                p += nTxChan;
            }
            // result[i] += rowResult[i] * kv[v] for i in {0..n-1}
            PtexUtils::VecAccumN<float>()(result, rowResult, nChan, *kvp++);
            p += rowskip;
        }
    }